

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

bool __thiscall BigInt::operator<(BigInt *this,BigInt *b)

{
  __type_conflict _Var1;
  bool bVar2;
  string sStack_68;
  string local_48;
  
  to_string_abi_cxx11_(&sStack_68,this);
  to_string_abi_cxx11_(&local_48,b);
  _Var1 = std::operator==(&sStack_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  if (_Var1) {
    bVar2 = false;
  }
  else {
    bVar2 = greater(this,b);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool BigInt::operator<(BigInt& b) {
    if (this->to_string() == b.to_string()) {
        return false;
    }
    return !this->greater(b);
}